

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O3

__cilkrts_worker *
execute_reductions_for_sync(__cilkrts_worker *w,full_frame *ff,__cilkrts_stack_frame *sf_at_sync)

{
  byte *pbVar1;
  full_frame *pfVar2;
  cilkred_map *left_map;
  pending_exception_info *ppVar3;
  cilkred_map *right_map;
  local_state *plVar4;
  cilkred_map **ppcVar5;
  pending_exception_info **pppVar6;
  __cilkrts_worker *local_50;
  __cilkrts_stack_frame *local_48;
  pending_exception_info **local_40;
  cilkred_map **local_38;
  
  ff->call_stack = (__cilkrts_stack_frame *)0x0;
  __cilkrts_put_stack(ff,sf_at_sync);
  __cilkrts_make_unrunnable_sysdep(w,ff,sf_at_sync,1,"execute_reductions_for_sync");
  plVar4 = w->l;
  if (plVar4->frame_ff == ff) {
    right_map = w->reducer_map;
    if ((right_map == (cilkred_map *)0x0) &&
       (ff->pending_exception == (pending_exception_info *)0x0)) {
LAB_0010d5c2:
      if (ff->call_stack == (__cilkrts_stack_frame *)0x0) {
        ff->call_stack = sf_at_sync;
        pbVar1 = (byte *)((long)&sf_at_sync->flags + 1);
        *pbVar1 = *pbVar1 | 0x80;
        plVar4->fiber_to_free = ff->fiber_self;
        ff->fiber_self = (cilk_fiber *)0x0;
        return w;
      }
      goto LAB_0010d611;
    }
    w->reducer_map = (cilkred_map *)0x0;
    local_38 = &ff->children_reducer_map;
    local_40 = &ff->child_pending_exception;
    local_50 = w;
    local_48 = sf_at_sync;
    while( true ) {
      __cilkrts_frame_lock(local_50,ff);
      pfVar2 = ff->rightmost_child;
      ppcVar5 = local_38;
      pppVar6 = local_40;
      if (pfVar2 != (full_frame *)0x0) {
        if (pfVar2->parent != ff) goto LAB_0010d602;
        ppcVar5 = &pfVar2->right_reducer_map;
        pppVar6 = &pfVar2->right_pending_exception;
      }
      left_map = *ppcVar5;
      *ppcVar5 = (cilkred_map *)0x0;
      ppVar3 = __cilkrts_merge_pending_exceptions(local_50,*pppVar6,ff->pending_exception);
      *pppVar6 = ppVar3;
      ff->pending_exception = (pending_exception_info *)0x0;
      if ((left_map == (cilkred_map *)0x0) || (right_map == (cilkred_map *)0x0)) {
        if (left_map != (cilkred_map *)0x0) {
          right_map = left_map;
        }
        *ppcVar5 = right_map;
        __cilkrts_frame_unlock(local_50,ff);
        plVar4 = local_50->l;
        w = local_50;
        sf_at_sync = local_48;
        if (plVar4->frame_ff == ff) goto LAB_0010d5c2;
        goto LAB_0010d60c;
      }
      __cilkrts_frame_unlock(local_50,ff);
      right_map = repeated_merge_reducer_maps(&local_50,left_map,right_map);
      if (ff->pending_exception != (pending_exception_info *)0x0) break;
      plVar4 = local_50->l;
      ff->pending_exception = plVar4->pending_exception;
      plVar4->pending_exception = (pending_exception_info *)0x0;
    }
    execute_reductions_for_sync_cold_3();
LAB_0010d602:
    execute_reductions_for_sync_cold_2();
  }
  execute_reductions_for_sync_cold_1();
LAB_0010d60c:
  execute_reductions_for_sync_cold_4();
LAB_0010d611:
  execute_reductions_for_sync_cold_5();
}

Assistant:

static __cilkrts_worker*
execute_reductions_for_sync(__cilkrts_worker *w,
                            full_frame *ff,
                            __cilkrts_stack_frame *sf_at_sync)
{
    int finished_reductions;
    // Step B1 from reducer protocol above:
    // Restore runtime invariants.
    //
    // The following code for this step is almost equivalent to
    // the following sequence:
    //   1. disown(w, ff, sf_at_sync, "sync") (which itself
    //        calls make_unrunnable(w, ff, sf_at_sync))
    //   2. make_runnable(w, ff, sf_at_sync).
    //
    // The "disown" will mark the frame "sf_at_sync"
    // as stolen and suspended, and save its place on the stack,
    // so it can be resumed after the sync. 
    //
    // The difference is, that we don't want the disown to 
    // break the following connections yet, since we are
    // about to immediately make sf/ff runnable again anyway.
    //   sf_at_sync->worker == w
    //   w->l->frame_ff == ff.
    //
    // These connections are needed for parallel reductions, since
    // we will use sf / ff as the stack frame / full frame for
    // executing any potential reductions.
    //
    // TBD: Can we refactor the disown / make_unrunnable code
    // to avoid the code duplication here?

    ff->call_stack = NULL;

    // Normally, "make_unrunnable" would add CILK_FRAME_STOLEN and
    // CILK_FRAME_SUSPENDED to sf_at_sync->flags and save the state of
    // the stack so that a worker can resume the frame in the correct
    // place.
    //
    // But on this path, CILK_FRAME_STOLEN should already be set.
    // Also, we technically don't want to suspend the frame until
    // the reduction finishes.
    // We do, however, need to save the stack before
    // we start any reductions, since the reductions might push more
    // data onto the stack.
    CILK_ASSERT(sf_at_sync->flags | CILK_FRAME_STOLEN);

    __cilkrts_put_stack(ff, sf_at_sync);
    __cilkrts_make_unrunnable_sysdep(w, ff, sf_at_sync, 1,
                                     "execute_reductions_for_sync");
    CILK_ASSERT(w->l->frame_ff == ff);

    // Step B2: Execute reductions on user stack.
    // Check if we have any "real" reductions to do.
    finished_reductions = fast_path_reductions_for_sync(w, ff);
    
    if (!finished_reductions) {
        // Still have some real reductions to execute.
        // Run them here.

        // This method may acquire/release the lock on ff.
        w = slow_path_reductions_for_sync(w, ff);

        // The previous call may return on a different worker.
        // than what we started on.
        verify_current_wkr(w);
    }

#if REDPAR_DEBUG >= 0
    CILK_ASSERT(w->l->frame_ff == ff);
    CILK_ASSERT(ff->call_stack == NULL);
#endif

    // Now we suspend the frame ff (since we've
    // finished the reductions).  Roughly, we've split apart the 
    // "make_unrunnable" call here --- we've already saved the
    // stack info earlier before the reductions execute.
    // All that remains is to restore the call stack back into the
    // full frame, and mark the frame as suspended.
    ff->call_stack = sf_at_sync;
    sf_at_sync->flags |= CILK_FRAME_SUSPENDED;

    // At a nontrivial sync, we should always free the current fiber,
    // because it can not be leftmost.
    w->l->fiber_to_free = ff->fiber_self;
    ff->fiber_self = NULL;
    return w;
}